

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http2.c
# Opt level: O0

int on_begin_headers(nghttp2_session *session,nghttp2_frame *frame,void *userp)

{
  Curl_easy *data_s;
  stream_ctx *stream;
  Curl_cfilter *cf;
  void *userp_local;
  nghttp2_frame *frame_local;
  nghttp2_session *session_local;
  
  nghttp2_session_get_stream_user_data(session,(frame->hd).stream_id);
  return 0;
}

Assistant:

static int on_begin_headers(nghttp2_session *session,
                            const nghttp2_frame *frame, void *userp)
{
  struct Curl_cfilter *cf = userp;
  struct stream_ctx *stream;
  struct Curl_easy *data_s = NULL;

  (void)cf;
  data_s = nghttp2_session_get_stream_user_data(session, frame->hd.stream_id);
  if(!data_s) {
    return 0;
  }

  if(frame->hd.type != NGHTTP2_HEADERS) {
    return 0;
  }

  stream = H2_STREAM_CTX(data_s);
  if(!stream || !stream->bodystarted) {
    return 0;
  }

  return 0;
}